

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
PossibleContentsTest_TestOracleNoFullCones_Test::PossibleContentsTest_TestOracleNoFullCones_Test
          (PossibleContentsTest_TestOracleNoFullCones_Test *this)

{
  PossibleContentsTest_TestOracleNoFullCones_Test *this_local;
  
  PossibleContentsTest::PossibleContentsTest(&this->super_PossibleContentsTest);
  (this->super_PossibleContentsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PossibleContentsTest_TestOracleNoFullCones_Test_005721b0;
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestOracleNoFullCones) {
  // PossibleContents should be normalized, so we never have full cones (depth
  // infinity).
  auto wasm = parse(R"(
    (module
      (type $A (sub (struct (field i32))))
      (type $B (sub $A (struct (field i32))))
      (type $C (sub $B (struct (field i32))))
      (func $foo (export "foo")
        ;; Note we must declare $C so that $B and $C have uses and are not
        ;; removed automatically from consideration.
        (param $a (ref $A)) (param $c (ref $C))
        (result (ref any))
        (local.get $a)
      )
    )
  )");
  ContentOracle oracle(*wasm, options);
  // The function is exported, and all we know about the parameter $a is that it
  // is some subtype of $A. This is normalized to depth 2 because that is the
  // actual depth of subtypes.
  auto bodyContents =
    oracle.getContents(ResultLocation{wasm->getFunction("foo"), 0});
  ASSERT_TRUE(bodyContents.isConeType());
  EXPECT_EQ(bodyContents.getCone().depth, Index(2));
}